

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.h
# Opt level: O3

void assert::are_equal<char[12],std::__cxx11::string>
               (char (*expected) [12],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,string *msg
               )

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  ostringstream s;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(expected: ",0xb);
  sVar3 = strlen(*expected);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*expected,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", actual: ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(actual->_M_dataplus)._M_p,actual->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  iVar1 = std::__cxx11::string::compare((char *)actual);
  std::__cxx11::stringbuf::str();
  is_true(iVar1 == 0,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void are_equal(const T1& expected, const T2& actual, std::string msg = "")
    {
        std::ostringstream s{};
        s << msg << "(expected: " << expected << ", actual: " << actual << ")";
        is_true(expected == actual, s.str());
    }